

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

OPJ_BOOL opj_dwt_encode_procedure
                   (opj_tcd_tilecomp_t *tilec,
                   _func_void_OPJ_INT32_ptr_OPJ_INT32_OPJ_INT32_OPJ_INT32 *p_function)

{
  OPJ_INT32 *pOVar1;
  int x;
  OPJ_UINT32 OVar2;
  int iVar3;
  int iVar4;
  int sn_00;
  int sn_01;
  uint cas;
  uint cas_00;
  ulong uVar5;
  OPJ_INT32 *a_00;
  OPJ_INT32 *pOVar6;
  OPJ_INT32 sn;
  OPJ_INT32 dn;
  OPJ_INT32 cas_row;
  OPJ_INT32 cas_col;
  OPJ_INT32 rh1;
  OPJ_INT32 rw1;
  opj_tcd_resolution_t *l_last_res;
  opj_tcd_resolution_t *l_cur_res;
  OPJ_SIZE_T l_data_size;
  OPJ_INT32 rh;
  OPJ_INT32 rw;
  OPJ_INT32 l;
  OPJ_INT32 w;
  OPJ_INT32 *bj;
  OPJ_INT32 *aj;
  OPJ_INT32 *a;
  int local_28;
  OPJ_INT32 k;
  OPJ_INT32 j;
  OPJ_INT32 i;
  _func_void_OPJ_INT32_ptr_OPJ_INT32_OPJ_INT32_OPJ_INT32 *p_function_local;
  opj_tcd_tilecomp_t *tilec_local;
  
  x = tilec->x1 - tilec->x0;
  k = tilec->numresolutions - 1;
  pOVar1 = tilec->data;
  l_last_res = tilec->resolutions + k;
  OVar2 = opj_dwt_max_resolution(tilec->resolutions,tilec->numresolutions);
  uVar5 = (ulong)OVar2;
  if (uVar5 < 0x4000000000000000) {
    a_00 = (OPJ_INT32 *)opj_malloc(uVar5 << 2);
    if ((uVar5 == 0) || (a_00 != (OPJ_INT32 *)0x0)) {
      while( true ) {
        _rh1 = l_last_res + -1;
        if (k == 0) break;
        iVar3 = l_last_res->x1 - l_last_res->x0;
        iVar4 = l_last_res->y1 - l_last_res->y0;
        sn_00 = l_last_res[-1].x1 - _rh1->x0;
        sn_01 = l_last_res[-1].y1 - l_last_res[-1].y0;
        cas = l_last_res->x0 & 1;
        cas_00 = l_last_res->y0 & 1;
        for (local_28 = 0; local_28 < iVar3; local_28 = local_28 + 1) {
          pOVar6 = pOVar1 + local_28;
          for (a._4_4_ = 0; a._4_4_ < iVar4; a._4_4_ = a._4_4_ + 1) {
            a_00[a._4_4_] = pOVar6[a._4_4_ * x];
          }
          (*p_function)(a_00,iVar4 - sn_01,sn_01,cas_00);
          opj_dwt_deinterleave_v(a_00,pOVar6,iVar4 - sn_01,sn_01,x,cas_00);
        }
        for (local_28 = 0; local_28 < iVar4; local_28 = local_28 + 1) {
          pOVar6 = pOVar1 + local_28 * x;
          for (a._4_4_ = 0; a._4_4_ < iVar3; a._4_4_ = a._4_4_ + 1) {
            a_00[a._4_4_] = pOVar6[a._4_4_];
          }
          (*p_function)(a_00,iVar3 - sn_00,sn_00,cas);
          opj_dwt_deinterleave_h(a_00,pOVar6,iVar3 - sn_00,sn_00,cas);
        }
        l_last_res = _rh1;
        k = k + -1;
      }
      opj_free(a_00);
      tilec_local._4_4_ = 1;
    }
    else {
      tilec_local._4_4_ = 0;
    }
  }
  else {
    tilec_local._4_4_ = 0;
  }
  return tilec_local._4_4_;
}

Assistant:

static INLINE OPJ_BOOL opj_dwt_encode_procedure(opj_tcd_tilecomp_t * tilec,
        void (*p_function)(OPJ_INT32 *, OPJ_INT32, OPJ_INT32, OPJ_INT32))
{
    OPJ_INT32 i, j, k;
    OPJ_INT32 *a = 00;
    OPJ_INT32 *aj = 00;
    OPJ_INT32 *bj = 00;
    OPJ_INT32 w, l;

    OPJ_INT32 rw;           /* width of the resolution level computed   */
    OPJ_INT32 rh;           /* height of the resolution level computed  */
    OPJ_SIZE_T l_data_size;

    opj_tcd_resolution_t * l_cur_res = 0;
    opj_tcd_resolution_t * l_last_res = 0;

    w = tilec->x1 - tilec->x0;
    l = (OPJ_INT32)tilec->numresolutions - 1;
    a = tilec->data;

    l_cur_res = tilec->resolutions + l;
    l_last_res = l_cur_res - 1;

    l_data_size = opj_dwt_max_resolution(tilec->resolutions, tilec->numresolutions);
    /* overflow check */
    if (l_data_size > (SIZE_MAX / sizeof(OPJ_INT32))) {
        /* FIXME event manager error callback */
        return OPJ_FALSE;
    }
    l_data_size *= sizeof(OPJ_INT32);
    bj = (OPJ_INT32*)opj_malloc(l_data_size);
    /* l_data_size is equal to 0 when numresolutions == 1 but bj is not used */
    /* in that case, so do not error out */
    if (l_data_size != 0 && ! bj) {
        return OPJ_FALSE;
    }
    i = l;

    while (i--) {
        OPJ_INT32 rw1;      /* width of the resolution level once lower than computed one                                       */
        OPJ_INT32 rh1;      /* height of the resolution level once lower than computed one                                      */
        OPJ_INT32 cas_col;  /* 0 = non inversion on horizontal filtering 1 = inversion between low-pass and high-pass filtering */
        OPJ_INT32 cas_row;  /* 0 = non inversion on vertical filtering 1 = inversion between low-pass and high-pass filtering   */
        OPJ_INT32 dn, sn;

        rw  = l_cur_res->x1 - l_cur_res->x0;
        rh  = l_cur_res->y1 - l_cur_res->y0;
        rw1 = l_last_res->x1 - l_last_res->x0;
        rh1 = l_last_res->y1 - l_last_res->y0;

        cas_row = l_cur_res->x0 & 1;
        cas_col = l_cur_res->y0 & 1;

        sn = rh1;
        dn = rh - rh1;
        for (j = 0; j < rw; ++j) {
            aj = a + j;
            for (k = 0; k < rh; ++k) {
                bj[k] = aj[k * w];
            }

            (*p_function)(bj, dn, sn, cas_col);

            opj_dwt_deinterleave_v(bj, aj, dn, sn, w, cas_col);
        }

        sn = rw1;
        dn = rw - rw1;

        for (j = 0; j < rh; j++) {
            aj = a + j * w;
            for (k = 0; k < rw; k++) {
                bj[k] = aj[k];
            }
            (*p_function)(bj, dn, sn, cas_row);
            opj_dwt_deinterleave_h(bj, aj, dn, sn, cas_row);
        }

        l_cur_res = l_last_res;

        --l_last_res;
    }

    opj_free(bj);
    return OPJ_TRUE;
}